

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapfilter.cpp
# Opt level: O0

QRectF * __thiscall
QPixmapDropShadowFilter::boundingRectFor(QPixmapDropShadowFilter *this,QRectF *rect)

{
  QPixmapDropShadowFilterPrivate *this_00;
  QPointF *in_RDX;
  QRectF *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  QPixmapDropShadowFilterPrivate *d;
  QRectF *this_01;
  QRectF *xp2;
  QRectF local_48;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  xp2 = in_RDI;
  this_00 = d_func((QPixmapDropShadowFilter *)0x4adda9);
  this_01 = &local_48;
  QRectF::translated(in_RSI,in_RDX);
  QRectF::adjusted((QRectF *)this_00,(qreal)local_28,(qreal)in_RDX,(qreal)xp2,(qreal)this_01);
  QRectF::united(this_01,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QPixmapDropShadowFilter::boundingRectFor(const QRectF &rect) const
{
    Q_D(const QPixmapDropShadowFilter);
    return rect.united(rect.translated(d->offset).adjusted(-d->radius, -d->radius, d->radius, d->radius));
}